

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqltablemodel.cpp
# Opt level: O2

QVariant * __thiscall
QSqlTableModel::headerData
          (QVariant *__return_storage_ptr__,QSqlTableModel *this,int section,Orientation orientation
          ,int role)

{
  long lVar1;
  long in_FS_OFFSET;
  QSqlRecord QStack_88;
  int section_local;
  ModifiedRow local_78;
  ModifiedRow local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  section_local = section;
  if (orientation == Vertical && role == 0) {
    lVar1 = *(long *)&(this->super_QSqlQueryModel).field_0x8;
    QSqlRecord::QSqlRecord(&QStack_88);
    QSqlTableModelPrivate::ModifiedRow::ModifiedRow(&local_78,None,&QStack_88);
    QMap<int,_QSqlTableModelPrivate::ModifiedRow>::value
              (&local_58,(QMap<int,_QSqlTableModelPrivate::ModifiedRow> *)(lVar1 + 0x2e0),
               &section_local,&local_78);
    QSqlTableModelPrivate::ModifiedRow::~ModifiedRow(&local_58);
    QSqlTableModelPrivate::ModifiedRow::~ModifiedRow(&local_78);
    QSqlRecord::~QSqlRecord(&QStack_88);
    if ((local_58.m_op == Insert) || (local_58.m_op == Delete)) {
      QVariant::QVariant(__return_storage_ptr__,(QLatin1String *)0x1);
      goto LAB_00134a9c;
    }
  }
  QSqlQueryModel::headerData
            (__return_storage_ptr__,&this->super_QSqlQueryModel,section_local,orientation,role);
LAB_00134a9c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QVariant QSqlTableModel::headerData(int section, Qt::Orientation orientation, int role) const
{
    Q_D(const QSqlTableModel);
    if (orientation == Qt::Vertical && role == Qt::DisplayRole) {
        const QSqlTableModelPrivate::Op op = d->cache.value(section).op();
        if (op == QSqlTableModelPrivate::Insert)
            return "*"_L1;
        else if (op == QSqlTableModelPrivate::Delete)
            return "!"_L1;
    }
    return QSqlQueryModel::headerData(section, orientation, role);
}